

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::hg(disp *this,cmatch *m)

{
  sub_match<const_char_*> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int in_stack_ffffffffffffff1c;
  match_results<const_char_*> *in_stack_ffffffffffffff20;
  string local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined1 local_a8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  booster::match_results<const_char_*>::operator[]
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x18);
  booster::sub_match::operator_cast_to_string(in_RDI);
  std::operator+((char *)__lhs,__rhs);
  std::operator+(__lhs,(char)((ulong)__rhs >> 0x38));
  booster::match_results<const_char_*>::operator[]
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  booster::sub_match::operator_cast_to_string(in_RDI);
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::__cxx11::string::operator=((string *)&in_RDI[1].matched,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)(local_a8 + 0x18));
  return;
}

Assistant:

void hg(booster::cmatch const &m)
	{ v_ = "m:" + std::string(m[0]) +':'+std::string(m[1]); }